

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onconnect.c
# Opt level: O1

int setup_listener(void)

{
  bool bVar1;
  int __fd;
  int iVar2;
  int one;
  sockaddr_in sin;
  undefined4 local_2c;
  sockaddr local_28;
  
  local_2c = 1;
  __fd = socket(2,1,0);
  if (__fd == -1) {
    setup_listener_cold_3();
  }
  else {
    local_28.sa_family = 2;
    local_28.sa_data[2] = (undefined1)cfg.addr;
    local_28.sa_data[3] = cfg.addr._1_1_;
    local_28.sa_data[4] = cfg.addr._2_1_;
    local_28.sa_data[5] = cfg.addr._3_1_;
    local_28.sa_data._0_2_ = (ushort)cfg.port << 8 | (ushort)cfg.port >> 8;
    setsockopt(__fd,1,2,&local_2c,4);
    iVar2 = bind(__fd,&local_28,0x10);
    if (iVar2 == -1) {
      setup_listener_cold_2();
    }
    else {
      iVar2 = listen(__fd,1);
      if (iVar2 != -1) {
        bVar1 = false;
        iVar2 = 0;
        cfg.listener_fd = __fd;
        goto LAB_00101827;
      }
      setup_listener_cold_1();
    }
  }
  iVar2 = -1;
  bVar1 = true;
LAB_00101827:
  if (bVar1 && __fd != -1) {
    close(__fd);
  }
  return iVar2;
}

Assistant:

int setup_listener() {
  int rc = -1, one=1;

  int fd = socket(AF_INET, SOCK_STREAM, 0);
  if (fd == -1) {
    fprintf(stderr,"socket: %s\n", strerror(errno));
    goto done;
  }

  /**********************************************************
   * internet socket address structure: our address and port
   *********************************************************/
  struct sockaddr_in sin;
  sin.sin_family = AF_INET;
  sin.sin_addr.s_addr = cfg.addr;
  sin.sin_port = htons(cfg.port);

  /**********************************************************
   * bind socket to address and port 
   *********************************************************/
  setsockopt(fd, SOL_SOCKET, SO_REUSEADDR, &one, sizeof(one));
  if (bind(fd, (struct sockaddr*)&sin, sizeof(sin)) == -1) {
    fprintf(stderr,"bind: %s\n", strerror(errno));
    goto done;
  }

  /**********************************************************
   * put socket into listening state
   *********************************************************/
  if (listen(fd,1) == -1) {
    fprintf(stderr,"listen: %s\n", strerror(errno));
    goto done;
  }

  cfg.listener_fd = fd;
  rc=0;

 done:
  if ((rc < 0) && (fd != -1)) close(fd);
  return rc;
}